

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::MergeReturnPass::CreateSingleCaseSwitch
          (MergeReturnPass *this,BasicBlock *merge_target)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  Analysis preserved_analyses;
  uint32_t default_id;
  uint32_t merge_id;
  reference this_00;
  Instruction *this_01;
  IRContext *pIVar4;
  BasicBlock *this_02;
  CFG *pCVar5;
  vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
  local_90;
  uint32_t local_74;
  undefined1 local_70 [4];
  uint32_t const_zero_id;
  InstructionBuilder builder;
  BasicBlock *old_block;
  iterator split_pos;
  BasicBlock *start_block;
  BasicBlock *merge_target_local;
  MergeReturnPass *this_local;
  
  _split_pos = Function::begin(this->function_);
  this_00 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                      ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&split_pos);
  BasicBlock::begin((BasicBlock *)&old_block);
  while( true ) {
    this_01 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<spvtools::opt::Instruction>::operator->
                        ((iterator_template<spvtools::opt::Instruction> *)&old_block);
    OVar2 = Instruction::opcode(this_01);
    if (OVar2 != OpVariable) break;
    InstructionList::iterator::operator++((iterator *)&old_block);
  }
  pIVar4 = Pass::context((Pass *)this);
  uVar3 = Pass::TakeNextId((Pass *)this);
  InstructionList::iterator::iterator
            ((iterator *)&builder.preserved_analyses_,(iterator *)&old_block);
  this_02 = BasicBlock::SplitBasicBlock
                      (this_00,pIVar4,uVar3,(iterator *)&builder.preserved_analyses_);
  pIVar4 = Pass::context((Pass *)this);
  preserved_analyses = operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)local_70,pIVar4,this_00,preserved_analyses);
  uVar3 = InstructionBuilder::GetUintConstantId((InstructionBuilder *)local_70,0);
  if (uVar3 == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_74 = uVar3;
    default_id = BasicBlock::id(this_02);
    memset(&local_90,0,0x18);
    std::
    vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
    ::vector(&local_90);
    merge_id = BasicBlock::id(merge_target);
    InstructionBuilder::AddSwitch
              ((InstructionBuilder *)local_70,uVar3,default_id,&local_90,merge_id,0);
    std::
    vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
    ::~vector(&local_90);
    pIVar4 = Pass::context((Pass *)this);
    bVar1 = IRContext::AreAnalysesValid(pIVar4,kAnalysisCFG);
    if (bVar1) {
      pCVar5 = Pass::cfg((Pass *)this);
      CFG::RegisterBlock(pCVar5,this_02);
      pCVar5 = Pass::cfg((Pass *)this);
      CFG::AddEdges(pCVar5,this_00);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool MergeReturnPass::CreateSingleCaseSwitch(BasicBlock* merge_target) {
  // Insert the switch before any code is run.  We have to split the entry
  // block to make sure the OpVariable instructions remain in the entry block.
  BasicBlock* start_block = &*function_->begin();
  auto split_pos = start_block->begin();
  while (split_pos->opcode() == spv::Op::OpVariable) {
    ++split_pos;
  }

  BasicBlock* old_block =
      start_block->SplitBasicBlock(context(), TakeNextId(), split_pos);

  // Add the switch to the end of the entry block.
  InstructionBuilder builder(
      context(), start_block,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  uint32_t const_zero_id = builder.GetUintConstantId(0u);
  if (const_zero_id == 0) {
    return false;
  }
  builder.AddSwitch(const_zero_id, old_block->id(), {}, merge_target->id());

  if (context()->AreAnalysesValid(IRContext::kAnalysisCFG)) {
    cfg()->RegisterBlock(old_block);
    cfg()->AddEdges(start_block);
  }
  return true;
}